

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printJPG(JPG *jpg)

{
  MCU *pMVar1;
  Block *paiVar2;
  uint uVar3;
  ostream *poVar4;
  Block **ppaiVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint ID;
  int *piVar9;
  ulong uVar10;
  uint q;
  long lVar11;
  pointer pSVar12;
  uint i;
  ulong uVar13;
  ulong local_58;
  ulong local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"width:",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"height:",7);
  lVar6 = 1;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ComponentID:",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (jpg->mcuHeight != 0) {
      local_58 = 0;
      do {
        uVar13 = (ulong)jpg->mcuWidth;
        if (jpg->mcuWidth != 0) {
          uVar10 = 0;
          do {
            pMVar1 = jpg->data;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"muc Row:",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," mcu column:",0xc);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            ID = (uint)lVar6;
            uVar3 = JPG::getVerticalSamplingFrequency(jpg,ID);
            if (uVar3 != 0) {
              local_50 = 0;
              do {
                uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                if (uVar3 != 0) {
                  uVar8 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Block row:",10);
                    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Block column:",0xe);
                    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                    ppaiVar5 = MCU::operator[](pMVar1 + (uint)((int)uVar13 * (int)local_58 +
                                                              (int)uVar10),ID);
                    paiVar2 = *ppaiVar5;
                    uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                    piVar9 = paiVar2[uVar3 * (int)local_50 + (int)uVar8];
                    lVar7 = 0;
                    do {
                      lVar11 = 0;
                      do {
                        poVar4 = (ostream *)
                                 std::ostream::operator<<((ostream *)&std::cout,piVar9[lVar11]);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != 8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n",1);
                      lVar7 = lVar7 + 1;
                      piVar9 = piVar9 + 8;
                    } while (lVar7 != 8);
                    uVar8 = uVar8 + 1;
                    uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                  } while (uVar8 < uVar3);
                }
                local_50 = local_50 + 1;
                uVar3 = JPG::getVerticalSamplingFrequency(jpg,ID);
              } while (local_50 < uVar3);
            }
            uVar10 = uVar10 + 1;
            uVar13 = (ulong)jpg->mcuWidth;
          } while (uVar10 < uVar13);
        }
        local_58 = local_58 + 1;
      } while (local_58 < jpg->mcuHeight);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DC Tables 0 ",0xc);
  uVar13 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    for (pSVar12 = (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar12 !=
        (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
      if (uVar13 == pSVar12->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DC Tables 1 ",0xc);
  uVar13 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    for (pSVar12 = (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar12 !=
        (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
      if (uVar13 == pSVar12->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AC Tables 0 ",0xc);
  uVar13 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    for (pSVar12 = (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar12 !=
        (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
      if (uVar13 == pSVar12->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AC Tables 1 ",0xc);
  uVar13 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    for (pSVar12 = (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar12 !=
        (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
      if (uVar13 == pSVar12->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x11);
  return;
}

Assistant:

void printJPG(const JPG& jpg) {
    std::cout << "width:" << jpg.width << " " << "height:" << jpg.height << "\n";
    for (uint componentID = 1; componentID <= 3; componentID++) {
        std::cout << "ComponentID:" << componentID << "\n";
        for (uint i = 0; i < jpg.mcuHeight; i++) {
            for (uint j = 0; j < jpg.mcuWidth; j++) {
                MCU& mcu = jpg.data[i * jpg.mcuWidth + j];
                std::cout << "muc Row:" << i << " mcu column:" << j << "\n";
                for (uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for (uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {
                        std::cout << "Block row:" << ii << " Block column:" << jj << "\n";
                        Block& block = mcu[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                std::cout << block[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                    }
                }
            }
        }
    }
    std::cout << "DC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yDC.sortedSymbol.cbegin(); it != jpg.yDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "DC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaDC.sortedSymbol.cbegin(); it != jpg.chromaDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";

    }
    std::cout << "AC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yAC.sortedSymbol.cbegin(); it != jpg.yAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "AC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaAC.sortedSymbol.cbegin(); it != jpg.chromaAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
}